

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_specific.cpp
# Opt level: O2

void * RoutineFunc(void *args)

{
  int iVar1;
  stRoutineSpecificData_t *psVar2;
  
  co_enable_hook_sys();
  iVar1 = *(int *)((long)args + 8);
  psVar2 = clsRoutineData_routine_stRoutineSpecificData_t<stRoutineSpecificData_t>::operator->
                     ((clsRoutineData_routine_stRoutineSpecificData_t<stRoutineSpecificData_t> *)
                      &__routine);
  psVar2->idx = iVar1;
  do {
    psVar2 = clsRoutineData_routine_stRoutineSpecificData_t<stRoutineSpecificData_t>::operator->
                       ((clsRoutineData_routine_stRoutineSpecificData_t<stRoutineSpecificData_t> *)
                        &__routine);
    printf("%s:%d routine specific data idx %d\n","RoutineFunc",0x2d,(ulong)(uint)psVar2->idx);
    poll((pollfd *)0x0,0,1000);
  } while( true );
}

Assistant:

void* RoutineFunc(void* args)
{
	co_enable_hook_sys();
	stRoutineArgs_t* routine_args = (stRoutineArgs_t*)args;
	__routine->idx = routine_args->routine_id;
	while (true)
	{
		printf("%s:%d routine specific data idx %d\n", __func__, __LINE__, __routine->idx);
		poll(NULL, 0, 1000);
	}
	return NULL;
}